

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

uint __thiscall Inline::CountActuals(Inline *this,Instr *callInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SymOpnd *pSVar4;
  StackSym *this_00;
  StackSym *sym;
  Instr *argInstr;
  Opnd *pOStack_20;
  uint actualCount;
  Opnd *linkOpnd;
  Instr *callInstr_local;
  Inline *this_local;
  
  pOStack_20 = IR::Instr::GetSrc2(callInstr);
  argInstr._4_4_ = 0;
  bVar2 = IR::Opnd::IsSymOpnd(pOStack_20);
  if (bVar2) {
    do {
      bVar2 = IR::Opnd::IsSymOpnd(pOStack_20);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1214,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pSVar4 = IR::Opnd::AsSymOpnd(pOStack_20);
      this_00 = Sym::AsStackSym(pSVar4->m_sym);
      if ((*(uint *)&this_00->field_0x18 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1216,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      bVar2 = StackSym::IsArgSlotSym(this_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1217,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      argInstr._4_4_ = argInstr._4_4_ + 1;
      pOStack_20 = IR::Instr::GetSrc2((this_00->field_5).m_instrDef);
      bVar2 = IR::Opnd::IsSymOpnd(pOStack_20);
    } while (bVar2);
  }
  return argInstr._4_4_;
}

Assistant:

uint Inline::CountActuals(IR::Instr *callInstr)
{
    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    uint actualCount = 0;
    if (linkOpnd->IsSymOpnd())
    {
        IR::Instr *argInstr;
        do
        {
            Assert(linkOpnd->IsSymOpnd());
            StackSym *sym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
            Assert(sym->m_isSingleDef);
            Assert(sym->IsArgSlotSym());
            argInstr = sym->m_instrDef;
            ++actualCount;
            linkOpnd = argInstr->GetSrc2();
        }
        while (linkOpnd->IsSymOpnd());
    }
    return actualCount;
}